

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O3

compile_errcode __thiscall
SymbolTable::GetArraySpace(SymbolTable *this,string *name,int *array_space)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  compile_errcode cVar2;
  SymbolTableTerm term;
  SymbolTableTerm local_50;
  
  paVar1 = &local_50.m_name.field_2;
  local_50.m_name._M_string_length = 0;
  local_50.m_name.field_2._M_local_buf[0] = '\0';
  local_50.m_name._M_dataplus._M_p = (pointer)paVar1;
  cVar2 = GetTerm(this,name,&local_50);
  if (cVar2 == 0) {
    *array_space = (int)local_50.m_other_information;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.m_name._M_dataplus._M_p);
  }
  return cVar2;
}

Assistant:

compile_errcode SymbolTable::GetArraySpace(const string& name, int& array_space) const {
    int ret = COMPILE_OK;
    SymbolTableTerm term;
    if ((ret = this->GetTerm(name, term)) != COMPILE_OK) {
        return ret;
    } else {
        array_space = term.GetArrayInformation();
        return COMPILE_OK;
    }
}